

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

void __thiscall ON_Mesh::Dump(ON_Mesh *this,ON_TextLog *dump)

{
  ON_MeshParameters *this_00;
  ON_2dPoint *pOVar1;
  ON_SurfaceCurvature *pOVar2;
  ON_MeshFace *pOVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ON_SHA1_Hash hash;
  ON_SHA1_Hash hash_00;
  ON_SHA1_Hash hash_01;
  ON_SHA1_Hash hash_02;
  ON_SHA1_Hash hash_03;
  ON_SHA1_Hash hash_04;
  ON_SHA1_Hash hash_05;
  ON_SHA1_Hash hash_06;
  bool bVar8;
  Type TVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  ON_3dPointArray *pOVar13;
  wchar_t *pwVar14;
  ON_MeshNgon *this_01;
  bool bNewLine;
  bool bNewLine_00;
  bool bNewLine_01;
  bool bNewLine_02;
  bool bNewLine_03;
  bool bNewLine_04;
  bool bNewLine_05;
  bool bNewLine_06;
  int iVar15;
  char *pcVar16;
  uint uVar17;
  ulong uVar18;
  ON_TextLogIndent *this_02;
  char *pcVar19;
  ON_3dPoint *pOVar20;
  uint uVar21;
  uint uVar22;
  ON_Mesh *mesh;
  ON_TextLogIndent indent1_2;
  undefined4 local_118;
  ON_TextLogIndent indent2;
  ON_TextLogIndent indent1;
  ON_3dPoint p;
  ON_TextLogIndent indent1_1;
  ON_wString local_38;
  
  uVar17 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  uVar12 = (this->m_F).m_count;
  bVar8 = false;
  if ((0 < (int)uVar17) &&
     (bVar8 = false, uVar17 == (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count)) {
    bVar8 = HasSynchronizedDoubleAndSinglePrecisionVertices(this);
  }
  ON_TextLog::Print(dump,"ON_Mesh: vertex count = %d  facet count = %d\n",(ulong)uVar17,
                    (ulong)uVar12);
  pcVar19 = "false";
  pcVar16 = "false";
  if (bVar8 != false) {
    pcVar16 = "true";
  }
  ON_TextLog::Print(dump,"double precision: %s\n",pcVar16);
  iVar15 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  pcVar16 = "false";
  if ((this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count == iVar15) {
    pcVar16 = "true";
  }
  if (iVar15 < 1) {
    pcVar16 = "false";
  }
  ON_TextLog::Print(dump,"vertex normals:   %s\n",pcVar16);
  iVar15 = (this->m_F).m_count;
  pcVar16 = "false";
  if ((this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count == iVar15) {
    pcVar16 = "true";
  }
  if (iVar15 < 1) {
    pcVar16 = "false";
  }
  ON_TextLog::Print(dump,"face normals:     %s\n",pcVar16);
  pcVar16 = "false";
  if ((this->m_Ngon).m_count != 0) {
    pcVar16 = "true";
  }
  if ((this->m_F).m_count < 1) {
    pcVar16 = "false";
  }
  ON_TextLog::Print(dump,"n-gons:           %s\n",pcVar16);
  iVar15 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  pcVar16 = "false";
  if ((this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count == iVar15) {
    pcVar16 = "true";
  }
  if (iVar15 < 1) {
    pcVar16 = "false";
  }
  ON_TextLog::Print(dump,"srf parameters:   %s\n",pcVar16);
  iVar15 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  pcVar16 = "false";
  if ((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == iVar15) {
    pcVar16 = "true";
  }
  if (iVar15 < 1) {
    pcVar16 = "false";
  }
  ON_TextLog::Print(dump,"tex coords:       %s\n",pcVar16);
  iVar15 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  pcVar16 = "false";
  if ((this->m_K).m_count == iVar15) {
    pcVar16 = "true";
  }
  if (iVar15 < 1) {
    pcVar16 = "false";
  }
  ON_TextLog::Print(dump,"vertex kappa:     %s\n",pcVar16);
  iVar15 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  pcVar16 = "false";
  if ((this->m_C).m_count == iVar15) {
    pcVar16 = "true";
  }
  if (iVar15 < 1) {
    pcVar16 = "false";
  }
  ON_TextLog::Print(dump,"vertex colors:    %s\n",pcVar16);
  ON_TextLog::Print(dump,"m_Ctag:\n");
  ON_TextLog::PushIndent(dump);
  ON_MappingTag::Dump(&this->m_Ctag,dump);
  ON_TextLog::PopIndent(dump);
  if (this->m_packed_tex_rotate != false) {
    pcVar19 = "true";
  }
  ON_TextLog::Print(dump,"m_packed_tex_rotate: %s\n",pcVar19);
  dVar4 = ON_Interval::operator[]((ON_Interval *)&this->field_0x270,0);
  dVar5 = ON_Interval::operator[]((ON_Interval *)&this->field_0x270,1);
  dVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x280,0);
  dVar7 = ON_Interval::operator[]((ON_Interval *)&this->field_0x280,1);
  ON_TextLog::Print(dump,"m_packed_tex_domain: (%g,%g)x(%g,%g)\n",SUB84(dVar4,0),dVar5,dVar6,dVar7);
  dVar4 = ON_Interval::operator[]((ON_Interval *)&this->field_0x240,0);
  dVar5 = ON_Interval::operator[]((ON_Interval *)&this->field_0x240,1);
  dVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x250,0);
  dVar7 = ON_Interval::operator[]((ON_Interval *)&this->field_0x250,1);
  ON_TextLog::Print(dump,"m_srf_domain: (%g,%g)x(%g,%g)\n",SUB84(dVar4,0),dVar5,dVar6,dVar7);
  ON_TextLog::Print(dump,"m_srf_scale: %g,%g\n",SUB84(this->m_srf_scale[0],0),this->m_srf_scale[0]);
  ON_TextLog::Print(dump,"m_Ttag:\n");
  ON_TextLog::PushIndent(dump);
  ON_MappingTag::Dump(&this->m_Ttag,dump);
  ON_TextLog::PopIndent(dump);
  ON_wString::ON_wString((ON_wString *)&indent1,L"Memory used: ");
  uVar11 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[8])(this);
  ON_wString::ToMemorySize((ON_wString *)&indent2,(ulong)uVar11);
  ON_wString::operator+((ON_wString *)&indent1_2,(ON_wString *)&indent1);
  ON_wString::ON_wString(&local_38,L"\n");
  ON_wString::operator+((ON_wString *)&indent1_1,(ON_wString *)&indent1_2);
  ON_TextLog::Print(dump,(ON_wString *)&indent1_1);
  ON_wString::~ON_wString((ON_wString *)&indent1_1);
  ON_wString::~ON_wString(&local_38);
  ON_wString::~ON_wString((ON_wString *)&indent1_2);
  ON_wString::~ON_wString((ON_wString *)&indent2);
  ON_wString::~ON_wString((ON_wString *)&indent1);
  this_00 = this->m_mesh_parameters;
  if (this_00 == (ON_MeshParameters *)0x0) goto LAB_005112fa;
  ON_String::ON_String((ON_String *)&indent1);
  TVar9 = ON_MeshParameters::GeometrySettingsType(this_00,true);
  switch(TVar9) {
  case Default:
    ON_String::ON_String((ON_String *)&indent1_1,"ON_MeshParameters::DefaultMesh");
    ON_String::operator=((ON_String *)&indent1,(ON_String *)&indent1_1);
    break;
  case FastRender:
    ON_String::ON_String((ON_String *)&indent1_1,"ON_MeshParameters::FastRenderMesh");
    ON_String::operator=((ON_String *)&indent1,(ON_String *)&indent1_1);
    break;
  case QualityRender:
    ON_String::ON_String((ON_String *)&indent1_1,"ON_MeshParameters::QualityRenderMesh");
    ON_String::operator=((ON_String *)&indent1,(ON_String *)&indent1_1);
    break;
  case DefaultAnalysis:
    ON_String::ON_String((ON_String *)&indent1_1,"ON_MeshParameters::DefaultAnalysisMesh");
    ON_String::operator=((ON_String *)&indent1,(ON_String *)&indent1_1);
    break;
  case FromMeshDensity:
    dVar4 = ON_MeshParameters::MeshDensity(this_00);
    ON_String::FormatToString
              ((char *)&indent1_1,SUB84(dVar4,0),"ON_MeshParameters::CreateFromMeshDensity(%g)");
    ON_String::operator=((ON_String *)&indent1,(ON_String *)&indent1_1);
    break;
  default:
    ON_String::operator=((ON_String *)&indent1,&ON_String::EmptyString);
    goto LAB_00511204;
  }
  ON_String::~ON_String((ON_String *)&indent1_1);
LAB_00511204:
  ON_TextLog::PrintNewLine(dump);
  bVar10 = ON_String::IsNotEmpty((ON_String *)&indent1);
  if (bVar10) {
    ON_TextLog::Print(dump,"NURBS, ON_Brep, ON_Extrusion meshing parameters:\n");
    ON_TextLogIndent::ON_TextLogIndent(&indent1_1,dump);
    pcVar16 = ON_String::operator_cast_to_char_((ON_String *)&indent1);
    ON_TextLog::Print(dump,"%s\n",pcVar16);
    ON_TextLogIndent::~ON_TextLogIndent(&indent1_1);
    ON_TextLog::Print(dump,"SubD meshing parameters:\n");
    ON_TextLogIndent::ON_TextLogIndent(&indent1_2,dump);
    ON_MeshParameters::SubDDisplayParameters((ON_SubDDisplayParameters *)&indent1_1,this_00);
    ON_SubDDisplayParameters::Dump((ON_SubDDisplayParameters *)&indent1_1,dump);
    this_02 = &indent1_2;
  }
  else {
    ON_TextLog::Print(dump,"Custom meshing parameters:\n");
    ON_TextLogIndent::ON_TextLogIndent(&indent1_1,dump);
    ON_MeshParameters::Dump(this_00,dump);
    this_02 = &indent1_1;
  }
  ON_TextLogIndent::~ON_TextLogIndent(this_02);
  ON_TextLog::PrintNewLine(dump);
  ON_String::~ON_String((ON_String *)&indent1);
LAB_005112fa:
  ON_TextLogIndent::ON_TextLogIndent(&indent1,dump);
  ON_TextLog::Print(dump,"%d mesh vertices:\n",
                    (ulong)(uint)(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count);
  ON_TextLogIndent::ON_TextLogIndent(&indent2,dump);
  ON_SHA1::ON_SHA1((ON_SHA1 *)&indent1_1);
  ON_SHA1_Accumulate3fPointArray
            ((ON_SHA1 *)&indent1_1,&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  ON_SHA1::Hash((ON_SHA1_Hash *)&indent1_2,(ON_SHA1 *)&indent1_1);
  hash.m_digest[8] = indent1_2.m_bEnabled;
  hash.m_digest[9] = indent1_2._9_1_;
  hash.m_digest[10] = indent1_2._10_1_;
  hash.m_digest[0xb] = indent1_2._11_1_;
  hash.m_digest[0xc] = indent1_2._12_1_;
  hash.m_digest[0xd] = indent1_2._13_1_;
  hash.m_digest[0xe] = indent1_2._14_1_;
  hash.m_digest[0xf] = indent1_2._15_1_;
  hash.m_digest._0_8_ = indent1_2.m_text_log;
  hash.m_digest._16_4_ = local_118;
  Internal_PrintMeshArrayHash(dump,hash,L"m_V array hash",bNewLine);
  if (bVar8 == false) {
    pOVar20 = (ON_3dPoint *)0x0;
  }
  else {
    ON_SHA1::ON_SHA1((ON_SHA1 *)&indent1_1);
    ON_SHA1_Accumulate3dPointArray
              ((ON_SHA1 *)&indent1_1,&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
    ON_SHA1::Hash((ON_SHA1_Hash *)&indent1_2,(ON_SHA1 *)&indent1_1);
    hash_00.m_digest[8] = indent1_2.m_bEnabled;
    hash_00.m_digest[9] = indent1_2._9_1_;
    hash_00.m_digest[10] = indent1_2._10_1_;
    hash_00.m_digest[0xb] = indent1_2._11_1_;
    hash_00.m_digest[0xc] = indent1_2._12_1_;
    hash_00.m_digest[0xd] = indent1_2._13_1_;
    hash_00.m_digest[0xe] = indent1_2._14_1_;
    hash_00.m_digest[0xf] = indent1_2._15_1_;
    hash_00.m_digest._0_8_ = indent1_2.m_text_log;
    hash_00.m_digest._16_4_ = local_118;
    Internal_PrintMeshArrayHash(dump,hash_00,L"m_dV array hash",bNewLine_00);
    pOVar13 = DoublePrecisionVertices(this);
    pOVar20 = (pOVar13->super_ON_SimpleArray<ON_3dPoint>).m_a;
  }
  uVar11 = uVar17 - 8;
  for (uVar21 = 0; (int)uVar21 < (int)uVar17; uVar21 = uVar21 + 1) {
    if (uVar21 == 8 && 0x10 < (int)uVar17) {
      ON_TextLog::Print(dump,"...\n");
      uVar21 = uVar11;
    }
    else {
      ON_3dPoint::operator=(&p,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + (int)uVar21);
      if (pOVar20 == (ON_3dPoint *)0x0) {
        ON_TextLog::Print(dump,"m_V[%d] = (%g,%g,%g)\n",SUB84(p.x,0),p.y,p.z,(ulong)uVar21);
      }
      else {
        ON_TextLog::Print(dump,"m_V[%d] = (%.17g,%.17g,%.17g) D = (%.17g,%.17g,%.17g)\n",
                          SUB84(p.x,0),p.y,p.z,pOVar20[(int)uVar21].x,pOVar20[(int)uVar21].y,
                          pOVar20[(int)uVar21].z,(ulong)uVar21);
      }
    }
  }
  ON_TextLogIndent::~ON_TextLogIndent(&indent2);
  iVar15 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  if ((0 < iVar15) && ((this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count == iVar15)) {
    ON_TextLog::Print(dump,"%d mesh vertex normals:\n");
    ON_TextLogIndent::ON_TextLogIndent(&indent2,dump);
    ON_SHA1::ON_SHA1((ON_SHA1 *)&indent1_1);
    ON_SHA1_Accumulate3fVectorArray
              ((ON_SHA1 *)&indent1_1,&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
    ON_SHA1::Hash((ON_SHA1_Hash *)&indent1_2,(ON_SHA1 *)&indent1_1);
    hash_01.m_digest[8] = indent1_2.m_bEnabled;
    hash_01.m_digest[9] = indent1_2._9_1_;
    hash_01.m_digest[10] = indent1_2._10_1_;
    hash_01.m_digest[0xb] = indent1_2._11_1_;
    hash_01.m_digest[0xc] = indent1_2._12_1_;
    hash_01.m_digest[0xd] = indent1_2._13_1_;
    hash_01.m_digest[0xe] = indent1_2._14_1_;
    hash_01.m_digest[0xf] = indent1_2._15_1_;
    hash_01.m_digest._0_8_ = indent1_2.m_text_log;
    hash_01.m_digest._16_4_ = local_118;
    Internal_PrintMeshArrayHash(dump,hash_01,L"m_N array hash",bNewLine_01);
    for (uVar21 = 0; (int)uVar21 < (int)uVar17; uVar21 = uVar21 + 1) {
      if (uVar21 == 8 && 0x10 < (int)uVar17) {
        ON_TextLog::Print(dump,"...\n");
        uVar21 = uVar11;
      }
      else {
        ON_3dPoint::operator=(&p,(this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a + (int)uVar21);
        ON_TextLog::Print(dump,"m_N[%d] = (%g,%g,%g)\n",SUB84(p.x,0),p.y,p.z,(ulong)uVar21);
      }
    }
    ON_TextLogIndent::~ON_TextLogIndent(&indent2);
    iVar15 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  }
  if ((0 < iVar15) && ((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == iVar15)) {
    ON_TextLog::Print(dump,"%d mesh vertex texture coordinates:\n");
    ON_TextLogIndent::ON_TextLogIndent(&indent2,dump);
    ON_SHA1::ON_SHA1((ON_SHA1 *)&indent1_1);
    ON_SHA1_Accumulate2fPointArray
              ((ON_SHA1 *)&indent1_1,&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
    ON_SHA1::Hash((ON_SHA1_Hash *)&indent1_2,(ON_SHA1 *)&indent1_1);
    hash_02.m_digest[8] = indent1_2.m_bEnabled;
    hash_02.m_digest[9] = indent1_2._9_1_;
    hash_02.m_digest[10] = indent1_2._10_1_;
    hash_02.m_digest[0xb] = indent1_2._11_1_;
    hash_02.m_digest[0xc] = indent1_2._12_1_;
    hash_02.m_digest[0xd] = indent1_2._13_1_;
    hash_02.m_digest[0xe] = indent1_2._14_1_;
    hash_02.m_digest[0xf] = indent1_2._15_1_;
    hash_02.m_digest._0_8_ = indent1_2.m_text_log;
    hash_02.m_digest._16_4_ = local_118;
    Internal_PrintMeshArrayHash(dump,hash_02,L"m_T array hash",bNewLine_02);
    for (uVar21 = 0; (int)uVar21 < (int)uVar17; uVar21 = uVar21 + 1) {
      if (uVar21 == 8 && 0x10 < (int)uVar17) {
        ON_TextLog::Print(dump,"...\n");
        uVar21 = uVar11;
      }
      else {
        ON_2dPoint::ON_2dPoint
                  ((ON_2dPoint *)&indent1_1,
                   (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a + (int)uVar21);
        ON_TextLog::Print(dump,"m_T[%d] = (%g,%g)\n",(int)indent1_1.m_text_log,indent1_1._8_8_,
                          (ulong)uVar21);
      }
    }
    ON_TextLogIndent::~ON_TextLogIndent(&indent2);
    iVar15 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  }
  if ((0 < iVar15) && ((this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count == iVar15)) {
    ON_TextLog::Print(dump,"%d mesh vertex surface parameters:\n");
    ON_TextLogIndent::ON_TextLogIndent(&indent2,dump);
    ON_SHA1::ON_SHA1((ON_SHA1 *)&indent1_1);
    ON_SHA1_Accumulate2dPointArray
              ((ON_SHA1 *)&indent1_1,&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
    ON_SHA1::Hash((ON_SHA1_Hash *)&indent1_2,(ON_SHA1 *)&indent1_1);
    hash_03.m_digest[8] = indent1_2.m_bEnabled;
    hash_03.m_digest[9] = indent1_2._9_1_;
    hash_03.m_digest[10] = indent1_2._10_1_;
    hash_03.m_digest[0xb] = indent1_2._11_1_;
    hash_03.m_digest[0xc] = indent1_2._12_1_;
    hash_03.m_digest[0xd] = indent1_2._13_1_;
    hash_03.m_digest[0xe] = indent1_2._14_1_;
    hash_03.m_digest[0xf] = indent1_2._15_1_;
    hash_03.m_digest._0_8_ = indent1_2.m_text_log;
    hash_03.m_digest._16_4_ = local_118;
    Internal_PrintMeshArrayHash(dump,hash_03,L"m_S array hash",bNewLine_03);
    uVar18 = 0;
    while (uVar21 = (uint)uVar18, (int)uVar21 < (int)uVar17) {
      if (uVar21 == 8 && 0x10 < (int)uVar17) {
        ON_TextLog::Print(dump,"...\n");
        uVar21 = uVar11;
      }
      else {
        pOVar1 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a;
        ON_TextLog::Print(dump,"m_S[%d] = (%g,%g)\n",SUB84(pOVar1[(int)uVar21].x,0),
                          pOVar1[(int)uVar21].y,uVar18);
      }
      uVar18 = (ulong)(uVar21 + 1);
    }
    ON_TextLogIndent::~ON_TextLogIndent(&indent2);
    iVar15 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  }
  if ((0 < iVar15) && ((this->m_C).m_count == iVar15)) {
    ON_TextLog::Print(dump,"%d mesh vertex colors:\n");
    ON_TextLogIndent::ON_TextLogIndent(&indent2,dump);
    ON_SHA1::ON_SHA1((ON_SHA1 *)&indent1_1);
    ON_SHA1::AccumulateInteger32Array
              ((ON_SHA1 *)&indent1_1,(long)(this->m_C).m_count,(ON__INT32 *)(this->m_C).m_a);
    ON_SHA1::Hash((ON_SHA1_Hash *)&indent1_2,(ON_SHA1 *)&indent1_1);
    hash_04.m_digest[8] = indent1_2.m_bEnabled;
    hash_04.m_digest[9] = indent1_2._9_1_;
    hash_04.m_digest[10] = indent1_2._10_1_;
    hash_04.m_digest[0xb] = indent1_2._11_1_;
    hash_04.m_digest[0xc] = indent1_2._12_1_;
    hash_04.m_digest[0xd] = indent1_2._13_1_;
    hash_04.m_digest[0xe] = indent1_2._14_1_;
    hash_04.m_digest[0xf] = indent1_2._15_1_;
    hash_04.m_digest._0_8_ = indent1_2.m_text_log;
    hash_04.m_digest._16_4_ = local_118;
    Internal_PrintMeshArrayHash(dump,hash_04,L"m_C array hash",bNewLine_04);
    for (uVar21 = 0; (int)uVar21 < (int)uVar17; uVar21 = uVar21 + 1) {
      if (uVar21 == 8 && 0x10 < (int)uVar17) {
        ON_TextLog::Print(dump,"...\n");
        uVar21 = uVar11;
      }
      else {
        ON_Color::ToString((ON_Color *)&indent1_1,
                           (char)((long)(int)uVar21 << 2) + (char)(this->m_C).m_a,L'\x0e',false);
        pwVar14 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&indent1_1);
        ON_TextLog::Print(dump,L"m_C[%d] = %s\n",(ulong)uVar21,pwVar14);
        ON_wString::~ON_wString((ON_wString *)&indent1_1);
      }
    }
    ON_TextLogIndent::~ON_TextLogIndent(&indent2);
    iVar15 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  }
  if ((0 < iVar15) && ((this->m_K).m_count == iVar15)) {
    ON_TextLog::Print(dump,"%d mesh vertex principal curvatures:\n");
    ON_TextLogIndent::ON_TextLogIndent(&indent2,dump);
    ON_SHA1::ON_SHA1((ON_SHA1 *)&indent1_1);
    ON_SHA1::AccumulateDoubleArray
              ((ON_SHA1 *)&indent1_1,(long)(this->m_K).m_count * 2,&((this->m_K).m_a)->k1);
    ON_SHA1::Hash((ON_SHA1_Hash *)&indent1_2,(ON_SHA1 *)&indent1_1);
    hash_05.m_digest[8] = indent1_2.m_bEnabled;
    hash_05.m_digest[9] = indent1_2._9_1_;
    hash_05.m_digest[10] = indent1_2._10_1_;
    hash_05.m_digest[0xb] = indent1_2._11_1_;
    hash_05.m_digest[0xc] = indent1_2._12_1_;
    hash_05.m_digest[0xd] = indent1_2._13_1_;
    hash_05.m_digest[0xe] = indent1_2._14_1_;
    hash_05.m_digest[0xf] = indent1_2._15_1_;
    hash_05.m_digest._0_8_ = indent1_2.m_text_log;
    hash_05.m_digest._16_4_ = local_118;
    Internal_PrintMeshArrayHash(dump,hash_05,L"m_K array hash",bNewLine_05);
    uVar18 = 0;
    while (uVar21 = (uint)uVar18, (int)uVar21 < (int)uVar17) {
      if (uVar21 == 8 && 0x10 < (int)uVar17) {
        ON_TextLog::Print(dump,"...\n");
        uVar21 = uVar11;
      }
      else {
        pOVar2 = (this->m_K).m_a;
        ON_TextLog::Print(dump,"m_K[%d] = (%g,%g)\n",SUB84(pOVar2[(int)uVar21].k1,0),
                          pOVar2[(int)uVar21].k2,uVar18);
      }
      uVar18 = (ulong)(uVar21 + 1);
    }
    ON_TextLogIndent::~ON_TextLogIndent(&indent2);
  }
  ON_TextLog::Print(dump,"%d mesh faces:\n",(ulong)(uint)(this->m_F).m_count);
  ON_TextLogIndent::ON_TextLogIndent(&indent2,dump);
  ON_SHA1::ON_SHA1((ON_SHA1 *)&indent1_1);
  ON_SHA1::AccumulateInteger32Array
            ((ON_SHA1 *)&indent1_1,(ulong)(uint)(this->m_F).m_count << 2,((this->m_F).m_a)->vi);
  ON_SHA1::Hash((ON_SHA1_Hash *)&indent1_2,(ON_SHA1 *)&indent1_1);
  uVar11 = (uint)indent1_2.m_text_log;
  hash_06.m_digest[8] = indent1_2.m_bEnabled;
  hash_06.m_digest[9] = indent1_2._9_1_;
  hash_06.m_digest[10] = indent1_2._10_1_;
  hash_06.m_digest[0xb] = indent1_2._11_1_;
  hash_06.m_digest[0xc] = indent1_2._12_1_;
  hash_06.m_digest[0xd] = indent1_2._13_1_;
  hash_06.m_digest[0xe] = indent1_2._14_1_;
  hash_06.m_digest[0xf] = indent1_2._15_1_;
  hash_06.m_digest._0_8_ = indent1_2.m_text_log;
  hash_06.m_digest._16_4_ = local_118;
  Internal_PrintMeshArrayHash(dump,hash_06,L"m_F array hash",bNewLine_06);
  for (uVar17 = 0; (int)uVar17 < (int)uVar12; uVar17 = uVar17 + 1) {
    if (uVar17 == 8 && 0x10 < (int)uVar12) {
      ON_TextLog::Print(dump,"...\n");
      uVar17 = uVar12 - 8;
      uVar22 = uVar11;
    }
    else {
      pOVar3 = (this->m_F).m_a;
      uVar21 = pOVar3[(int)uVar17].vi[2];
      uVar22 = pOVar3[(int)uVar17].vi[3];
      if (uVar21 == uVar22) {
        ON_TextLog::Print(dump,"m_F[%d].vi = (%d,%d,%d)\n",(ulong)uVar17,
                          (ulong)(uint)pOVar3[(int)uVar17].vi[0],
                          (ulong)(uint)pOVar3[(int)uVar17].vi[1],(ulong)uVar21,uVar11);
        uVar22 = uVar11;
      }
      else {
        ON_TextLog::Print(dump,"m_F[%d].vi = (%d,%d,%d,%d)\n",(ulong)uVar17,
                          (ulong)(uint)pOVar3[(int)uVar17].vi[0],
                          (ulong)(uint)pOVar3[(int)uVar17].vi[1],(ulong)uVar21,uVar22);
      }
    }
    uVar11 = uVar22;
  }
  ON_TextLogIndent::~ON_TextLogIndent(&indent2);
  iVar15 = (this->m_F).m_count;
  if ((0 < iVar15) && ((this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count == iVar15)) {
    ON_TextLog::Print(dump,"%d mesh face normals:\n");
    ON_TextLogIndent::ON_TextLogIndent(&indent1_1,dump);
    for (uVar17 = 0; (int)uVar17 < (int)uVar12; uVar17 = uVar17 + 1) {
      if (uVar17 == 8 && 0x10 < (int)uVar12) {
        ON_TextLog::Print(dump,"...\n");
        uVar17 = uVar12 - 8;
      }
      else {
        ON_3dPoint::operator=(&p,(this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_a + (int)uVar17);
        ON_TextLog::Print(dump,"m_FN[%d] = (%g,%g,%g)\n",SUB84(p.x,0),p.y,p.z,(ulong)uVar17);
      }
    }
    ON_TextLogIndent::~ON_TextLogIndent(&indent1_1);
    iVar15 = (this->m_F).m_count;
  }
  if ((0 < iVar15) && ((this->m_Ngon).m_count != 0)) {
    ON_MeshFaceList::ON_MeshFaceList((ON_MeshFaceList *)&indent1_1,this);
    uVar12 = NgonCount(this);
    ON_TextLog::Print(dump,"%d mesh n-gons:\n",(ulong)uVar12);
    ON_TextLogIndent::ON_TextLogIndent(&indent1_2,dump);
    for (uVar17 = 0; (int)uVar17 < (int)uVar12; uVar17 = uVar17 + 1) {
      if (uVar17 == 8 && 0x10 < (int)uVar12) {
        ON_TextLog::Print(dump,"...\n");
        uVar17 = uVar12 - 8;
      }
      else {
        this_01 = Ngon(this,uVar17);
        if (this_01 == (ON_MeshNgon *)0x0) {
          ON_TextLog::Print(dump,"Ngon(%d) = null\n",(ulong)uVar17);
        }
        else {
          ON_TextLog::Print(dump,"Ngon(%d): ",(ulong)uVar17);
          ON_MeshNgon::Dump(this_01,dump);
          uVar11 = ON_MeshNgon::BoundaryEdgeCount(this_01,(ON_MeshFaceList *)&indent1_1);
          uVar21 = ON_MeshNgon::OuterBoundaryEdgeCount(this_01);
          ON_TextLog::Print(dump," boundary counts outer = %d, inner = %d",(ulong)uVar21,
                            (ulong)(uVar11 - uVar21));
          ON_TextLog::Print(dump,"\n");
        }
      }
    }
    ON_TextLogIndent::~ON_TextLogIndent(&indent1_2);
  }
  ON_TextLogIndent::~ON_TextLogIndent(&indent1);
  return;
}

Assistant:

void ON_Mesh::Dump( ON_TextLog& dump ) const
{
  const int half_max = 8;

  const int fcount = m_F.Count();
  int i;
  const int vcount = m_V.Count();
  ON_3dPoint p, q;

  bool bDoubles =    vcount > 0 
                  && HasDoublePrecisionVertices()
                  && HasSynchronizedDoubleAndSinglePrecisionVertices();

  dump.Print("ON_Mesh: vertex count = %d  facet count = %d\n", m_V.Count(), m_F.Count() );
  dump.Print("double precision: %s\n",bDoubles?"true":"false");
  dump.Print("vertex normals:   %s\n",HasVertexNormals()?"true":"false");
  dump.Print("face normals:     %s\n",HasFaceNormals()?"true":"false");
  dump.Print("n-gons:           %s\n",HasNgons()?"true":"false");
  dump.Print("srf parameters:   %s\n",HasSurfaceParameters()?"true":"false");
  dump.Print("tex coords:       %s\n",HasTextureCoordinates()?"true":"false");
  dump.Print("vertex kappa:     %s\n",HasPrincipalCurvatures()?"true":"false");
  dump.Print("vertex colors:    %s\n",HasVertexColors()?"true":"false");
  dump.Print("m_Ctag:\n"); dump.PushIndent(); m_Ctag.Dump(dump); dump.PopIndent();
  dump.Print("m_packed_tex_rotate: %s\n",m_packed_tex_rotate?"true":"false");
  dump.Print("m_packed_tex_domain: (%g,%g)x(%g,%g)\n",
             m_packed_tex_domain[0][0],m_packed_tex_domain[0][1],
             m_packed_tex_domain[1][0],m_packed_tex_domain[1][1]);
  dump.Print("m_srf_domain: (%g,%g)x(%g,%g)\n",m_srf_domain[0][0],m_srf_domain[0][1],m_srf_domain[1][0],m_srf_domain[1][1]);
  dump.Print("m_srf_scale: %g,%g\n",m_srf_scale[0],m_srf_scale[0]);
  dump.Print("m_Ttag:\n"); dump.PushIndent(); m_Ttag.Dump(dump); dump.PopIndent();
  dump.Print( ON_wString(L"Memory used: ")  + ON_wString::ToMemorySize(this->SizeOf()) + ON_wString(L"\n") );


  const ON_MeshParameters* mp = this->MeshParameters();
  if (nullptr != mp)
  {
    ON_String description;
    switch (mp->GeometrySettingsType(true))
    {
    case ON_MeshParameters::Type::Unset:
      description = ON_String::EmptyString;
      break;
    case ON_MeshParameters::Type::Default:
      description = ON_String("ON_MeshParameters::DefaultMesh");
      break;
    case ON_MeshParameters::Type::FastRender:
      description = ON_String("ON_MeshParameters::FastRenderMesh");
      break;
    case ON_MeshParameters::Type::QualityRender:
      description = ON_String("ON_MeshParameters::QualityRenderMesh");
      break;
    case ON_MeshParameters::Type::DefaultAnalysis:
      description = ON_String("ON_MeshParameters::DefaultAnalysisMesh");
      break;
    case ON_MeshParameters::Type::FromMeshDensity:
      description = ON_String::FormatToString("ON_MeshParameters::CreateFromMeshDensity(%g)", mp->MeshDensity());
      break;
    case ON_MeshParameters::Type::Custom:
      description = ON_String::EmptyString;
      break;
    default:
      description = ON_String::EmptyString;
      break;
    }

    dump.PrintNewLine();
    if (description.IsNotEmpty())
    {
      dump.Print("NURBS, ON_Brep, ON_Extrusion meshing parameters:\n");
      {
        const ON_TextLogIndent indent1(dump);
        dump.Print("%s\n", static_cast<const char*>(description));
      }
      dump.Print("SubD meshing parameters:\n");
      {
        const ON_TextLogIndent indent1(dump);
        const ON_SubDDisplayParameters subdmp = mp->SubDDisplayParameters();
        subdmp.Dump(dump);
      }
    }
    else
    {
      dump.Print("Custom meshing parameters:\n");
      const ON_TextLogIndent indent1(dump);
      mp->Dump(dump);
    }
    dump.PrintNewLine();
  }

  const ON_TextLogIndent indent1(dump);

  dump.Print("%d mesh vertices:\n",m_V.Count());
  {
    const ON_TextLogIndent indent2(dump);
    Internal_PrintMeshArrayHash(dump, m_V, L"m_V array hash", true);
    const ON_3dPoint* D = 0;
    if ( bDoubles )
    {
      Internal_PrintMeshArrayHash(dump, m_dV, L"m_dV array hash", true);
      D = DoublePrecisionVertices().Array();
    }
    for (i = 0; i < vcount; i++)
    {
      if ( i == half_max && 2*half_max < vcount )
      {
        dump.Print("...\n");
        i = vcount-half_max;
      }
      else
      {
        p = m_V[i];
        if ( 0 != D )
        {
          q = D[i];
          dump.Print("m_V[%d] = (%.17g,%.17g,%.17g) D = (%.17g,%.17g,%.17g)\n",
                     i,
                     p.x,p.y,p.z,
                     q.x,q.y,q.z
                     );
        }
        else
        {
          dump.Print("m_V[%d] = (%g,%g,%g)\n",i,p.x,p.y,p.z);
        }
      }
    }
  }

  if ( HasVertexNormals() )
  {
    dump.Print("%d mesh vertex normals:\n",m_N.Count());
    {
      const ON_TextLogIndent indent2(dump);
      Internal_PrintMeshArrayHash(dump, m_N, L"m_N array hash", true);
      for (i = 0; i < vcount; i++)
      {
        if ( i == half_max && 2*half_max < vcount )
        {
          dump.Print("...\n");
          i = vcount-half_max;
        }
        else
        {
          p = m_N[i];
          dump.Print("m_N[%d] = (%g,%g,%g)\n",i,p.x,p.y,p.z);
        }
      }
    }
  }

  if ( HasTextureCoordinates() )
  {
    dump.Print("%d mesh vertex texture coordinates:\n",m_T.Count());
    {
      const ON_TextLogIndent indent2(dump);
      Internal_PrintMeshArrayHash(dump, m_T, L"m_T array hash", true);
      for (i = 0; i < vcount; i++)
      {
        if ( i == half_max && 2*half_max < vcount )
        {
          dump.Print("...\n");
          i = vcount-half_max;
        }
        else
        {
          const ON_2dPoint tp(m_T[i]);
          dump.Print("m_T[%d] = (%g,%g)\n",i,tp.x,tp.y);
        }
      }
    }
  }

  if ( HasSurfaceParameters() )
  {
    dump.Print("%d mesh vertex surface parameters:\n",m_S.Count());
    {
      const ON_TextLogIndent indent2(dump);
      Internal_PrintMeshArrayHash(dump, m_S, L"m_S array hash", true);
      for (i = 0; i < vcount; i++)
      {
        if ( i == half_max && 2*half_max < vcount )
        {
          dump.Print("...\n");
          i = vcount-half_max;
        }
        else
        {
          const ON_2dPoint srfuv = m_S[i];
          dump.Print("m_S[%d] = (%g,%g)\n",i, srfuv.x, srfuv.y);
        }
      }
    }
  }

  if (this->HasVertexColors())
  {
    dump.Print("%d mesh vertex colors:\n", m_C.Count());
    {
      const ON_TextLogIndent indent2(dump);
      Internal_PrintMeshArrayHash(dump, m_C, L"m_C array hash", true);
      for (i = 0; i < vcount; i++)
      {
        if (i == half_max && 2 * half_max < vcount)
        {
          dump.Print("...\n");
          i = vcount - half_max;
        }
        else
        {
          const ON_wString s = m_C[i].ToString(ON_Color::TextFormat::HashRGBa, 0, true);
          dump.Print(L"m_C[%d] = %s\n", i, static_cast<const wchar_t*>(s));
        }
      }
    }
  }


  if (this->HasPrincipalCurvatures())
  {
    dump.Print("%d mesh vertex principal curvatures:\n", m_K.Count());
    {
      const ON_TextLogIndent indent2(dump);
      Internal_PrintMeshArrayHash(dump, m_K, L"m_K array hash", true);
      for (i = 0; i < vcount; i++)
      {
        if (i == half_max && 2 * half_max < vcount)
        {
          dump.Print("...\n");
          i = vcount - half_max;
        }
        else
        {
          const ON_SurfaceCurvature k = m_K[i];
          dump.Print("m_K[%d] = (%g,%g)\n", i, k.k1, k.k2);
        }
      }
    }
  }


  dump.Print("%d mesh faces:\n",m_F.Count());
  {
    const ON_TextLogIndent indent2(dump);
    Internal_PrintMeshArrayHash(dump, m_F, L"m_F array hash", true);
    for (i = 0; i < fcount; i++)
    {
      if ( i == half_max && 2*half_max < fcount )
      {
        dump.Print("...\n");
        i = fcount-half_max;
      }
      else if ( m_F[i].vi[2] == m_F[i].vi[3] )
        dump.Print("m_F[%d].vi = (%d,%d,%d)\n",i,m_F[i].vi[0],m_F[i].vi[1],m_F[i].vi[2]);
      else
        dump.Print("m_F[%d].vi = (%d,%d,%d,%d)\n",i,m_F[i].vi[0],m_F[i].vi[1],m_F[i].vi[2],m_F[i].vi[3]);
    }
  }

  if ( HasFaceNormals() )
  {
    dump.Print("%d mesh face normals:\n",m_FN.Count());
    {
      const ON_TextLogIndent indent2(dump);
      for (i = 0; i < fcount; i++)
      {
        if ( i == half_max && 2*half_max < fcount )
        {
          dump.Print("...\n");
          i = fcount-half_max;
        }
        else
        {
          p = m_FN[i];
          dump.Print("m_FN[%d] = (%g,%g,%g)\n",i,p.x,p.y,p.z);
        }
      }
    }
  }

  if ( HasNgons() )
  {
    const ON_MeshFaceList mesh_face_list(this);

    const int ngon_count = NgonCount();
    dump.Print("%d mesh n-gons:\n",ngon_count);
    {
      const ON_TextLogIndent indent2(dump);
      for (i = 0; i < ngon_count; i++)
      {
        if ( i == half_max && 2*half_max < ngon_count )
        {
          dump.Print("...\n");
          i = ngon_count-half_max;
        }
        else
        {
          const ON_MeshNgon* ngon = Ngon(i);
          if ( 0 == ngon )
            dump.Print("Ngon(%d) = null\n",i);
          else
          {
            dump.Print("Ngon(%d): ",i);
            ngon->Dump(dump);
            const int bcount = (int)ngon->BoundaryEdgeCount(mesh_face_list);
            const int outer_boundary_count = (int)ngon->OuterBoundaryEdgeCount();
            const int inner_boundary_count = bcount - outer_boundary_count;
            dump.Print(" boundary counts outer = %d, inner = %d", outer_boundary_count, inner_boundary_count);
            dump.Print("\n");
          }
        }
      }
    }
  }
}